

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testTiledRgba.cpp
# Opt level: O1

void testTiledRgba(string *tempDir)

{
  float *pfVar1;
  pointer pcVar2;
  Compression comp;
  ushort uVar3;
  _Alloc_hider _Var4;
  byte bVar5;
  char cVar6;
  ushort uVar7;
  short sVar8;
  int iVar9;
  Compression CVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  long *plVar14;
  ostream *this;
  Rgba *pRVar15;
  LineOrder *pLVar16;
  Rgba *pRVar17;
  Box2i *pBVar18;
  half *phVar19;
  char *b;
  char *b_00;
  ChannelList *pCVar20;
  half *phVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar25;
  ulong uVar26;
  undefined1 in_R10B;
  int x_4;
  Rgba *pRVar27;
  char *pcVar28;
  int i;
  long lVar29;
  ulong uVar30;
  long lVar31;
  int tileY;
  int tileX;
  ulong uVar32;
  bool bVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  Rgba *local_150;
  string fileName;
  Header header;
  string fileName_1;
  uif x_2;
  uif x_1;
  TiledRgbaOutputFile out;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Testing the tiled RGBA image interface",0x26);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  bVar5 = IlmThread_2_5::supportsThreads();
  uVar3 = _DAT_0044233e;
  uVar13 = 0;
  while( true ) {
    cVar6 = IlmThread_2_5::supportsThreads();
    if (cVar6 != '\0') {
      Imf_2_5::setGlobalThreadCount(uVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nnumber of threads: ",0x14);
      iVar9 = Imf_2_5::globalThreadCount();
      plVar14 = (long *)std::ostream::operator<<(&std::cout,iVar9);
      std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
      std::ostream::put((char)plVar14);
      std::ostream::flush();
    }
    lVar29 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nImage size = ",0xe);
      iVar9 = (&DAT_002179d0)[lVar29];
      this = (ostream *)std::ostream::operator<<(&std::cout,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>(this," x ",3);
      iVar23 = (&DAT_002179e0)[lVar29];
      plVar14 = (long *)std::ostream::operator<<(this,iVar23);
      std::ios::widen((char)*(undefined8 *)(*plVar14 + -0x18) + (char)plVar14);
      std::ostream::put((char)plVar14);
      std::ostream::flush();
      CVar10 = NO_COMPRESSION;
      do {
        comp = CVar10;
        if (CVar10 == ZIP_COMPRESSION) {
          comp = PIZ_COMPRESSION;
        }
        if (lVar29 == 0) {
          anon_unknown.dwarf_2deefa::writeRead(tempDir,iVar9,iVar23,comp,1,1);
        }
        anon_unknown.dwarf_2deefa::writeRead(tempDir,iVar9,iVar23,comp,0x23,0x1a);
        anon_unknown.dwarf_2deefa::writeRead(tempDir,iVar9,iVar23,comp,0x4b,0x34);
        anon_unknown.dwarf_2deefa::writeRead(tempDir,iVar9,iVar23,comp,0x108,0x81);
        CVar10 = comp + RLE_COMPRESSION;
      } while ((int)comp < 9);
      lVar29 = lVar29 + 1;
    } while (lVar29 != 4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"\nfile with missing and broken tiles",0x23);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
    pcVar2 = (tempDir->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&fileName,pcVar2,pcVar2 + tempDir->_M_string_length);
    std::__cxx11::string::append((char *)&fileName);
    pRVar15 = (Rgba *)operator_new__(960000);
    uVar26 = 0;
    local_150 = pRVar15;
    do {
      uVar30 = uVar26 & 0xffffffff;
      iVar23 = (int)(uVar30 / 0x17) + (int)(uVar30 / 0x17) * -0x18 + (int)uVar26;
      fVar34 = (float)iVar23;
      iVar9 = (int)uVar26 + (int)(uVar30 / 0x1d) * -2 + (int)(uVar30 / 0x1d) * -0x1b;
      fVar35 = (float)iVar9;
      uVar30 = 0;
      do {
        uVar32 = uVar30 & 0xffffffff;
        iVar22 = (int)uVar30 + (int)(uVar32 / 5) * -5;
        fVar36 = (float)iVar22;
        if (iVar22 == 0) {
          uVar11 = (uint)fVar36 >> 0x10;
        }
        else {
          uVar7 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar36 >> 0x17) * 2);
          if (uVar7 == 0) {
            uVar11 = half::convert((int)fVar36);
          }
          else {
            uVar11 = (uint)uVar7 +
                     (((uint)fVar36 & 0x7fffff) + 0xfff + (uint)(((uint)fVar36 >> 0xd & 1) != 0) >>
                     0xd);
          }
        }
        iVar22 = (int)uVar30 -
                 (((uint)(uVar32 * 0xf0f0f0f1 >> 0x20) & 0xfffffff0) + (int)(uVar32 / 0x11));
        fVar36 = (float)iVar22;
        if (iVar22 == 0) {
          uVar12 = (uint)fVar36 >> 0x10;
        }
        else {
          uVar7 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar36 >> 0x17) * 2);
          if (uVar7 == 0) {
            uVar12 = half::convert((int)fVar36);
          }
          else {
            uVar12 = (uint)uVar7 +
                     (((uint)fVar36 & 0x7fffff) + 0xfff + (uint)(((uint)fVar36 >> 0xd & 1) != 0) >>
                     0xd);
          }
        }
        uVar25 = (uint)fVar34 >> 0x10;
        if (iVar23 != 0) {
          uVar7 = *(ushort *)((long)&half::_eLut + (ulong)((uint)fVar34 >> 0x17) * 2);
          if (uVar7 == 0) {
            uVar25 = half::convert((int)fVar34);
          }
          else {
            uVar25 = (uint)uVar7 +
                     (((uint)fVar34 & 0x7fffff) + 0xfff + (uint)(((uint)fVar34 >> 0xd & 1) != 0) >>
                     0xd);
          }
        }
        uVar7 = (ushort)((uint)fVar35 >> 0x10);
        if (iVar9 != 0) {
          sVar8 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar35 >> 0x17) * 2);
          if (sVar8 == 0) {
            uVar7 = half::convert((int)fVar35);
          }
          else {
            uVar7 = sVar8 + (short)(((uint)fVar35 & 0x7fffff) + 0xfff +
                                    (uint)(((uint)fVar35 >> 0xd & 1) != 0) >> 0xd);
          }
        }
        local_150[uVar30] =
             (Rgba)((ulong)(uVar11 & 0xffff) |
                   (ulong)(uVar12 << 0x10) | (ulong)(uVar25 & 0xffff) << 0x20 | (ulong)uVar7 << 0x30
                   );
        uVar30 = uVar30 + 1;
      } while (uVar30 != 400);
      uVar26 = uVar26 + 1;
      local_150 = local_150 + 400;
    } while (uVar26 != 300);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"writing",7);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    remove(fileName._M_dataplus._M_p);
    out._vptr_TiledRgbaOutputFile = (_func_int **)0x0;
    Imf_2_5::Header::Header(&header,400,300,1.0,(V2f *)&out,1.0,INCREASING_Y,ZIP_COMPRESSION);
    pLVar16 = Imf_2_5::Header::lineOrder(&header);
    _Var4 = fileName._M_dataplus;
    *pLVar16 = RANDOM_Y;
    iVar9 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledRgbaOutputFile::TiledRgbaOutputFile
              (&out,_Var4._M_p,&header,WRITE_RGBA,0x1e,0x28,ONE_LEVEL,ROUND_DOWN,iVar9);
    Imf_2_5::TiledRgbaOutputFile::setFrameBuffer(&out,pRVar15,1,400);
    Imf_2_5::TiledRgbaOutputFile::writeTile(&out,0,0,0);
    for (iVar9 = 0; iVar23 = Imf_2_5::TiledRgbaOutputFile::numYTiles(&out,0), iVar9 < iVar23;
        iVar9 = iVar9 + 1) {
      for (iVar23 = 0; iVar22 = Imf_2_5::TiledRgbaOutputFile::numXTiles(&out,0), iVar23 < iVar22;
          iVar23 = iVar23 + 1) {
        if ((iVar9 + iVar23 & 1U) != 0) {
          Imf_2_5::TiledRgbaOutputFile::writeTile(&out,iVar23,iVar9,0);
        }
      }
    }
    Imf_2_5::TiledRgbaOutputFile::writeTile(&out,2,0,0);
    Imf_2_5::TiledRgbaOutputFile::breakTile(&out,0,0,0,0,0x19,10,-1);
    Imf_2_5::TiledRgbaOutputFile::breakTile(&out,2,0,0,0,0x19,10,-1);
    Imf_2_5::TiledRgbaOutputFile::~TiledRgbaOutputFile(&out);
    Imf_2_5::Header::~Header(&header);
    pRVar17 = (Rgba *)operator_new__(960000);
    lVar29 = 0;
    pRVar27 = pRVar17;
    do {
      lVar31 = 0;
      do {
        uVar12 = (uint)uVar3;
        uVar11 = uVar12;
        if (uVar3 == 0) {
          uVar11 = half::convert(-0x40800000);
          uVar12 = half::convert(-0x40800000);
        }
        uVar24 = (uint)uVar3;
        uVar7 = uVar3;
        uVar25 = uVar24;
        if (uVar3 == 0) {
          uVar25 = half::convert(-0x40800000);
          uVar7 = half::convert(-0x40800000);
        }
        pRVar27[lVar31] =
             (Rgba)((ulong)(uVar11 & 0xffff) |
                   (ulong)(uVar12 << 0x10) | (ulong)(uVar25 & 0xffff) << 0x20 | (ulong)uVar7 << 0x30
                   );
        lVar31 = lVar31 + 1;
      } while (lVar31 != 400);
      lVar29 = lVar29 + 1;
      pRVar27 = pRVar27 + 400;
    } while (lVar29 != 300);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"reading one tile at a time,",0x1b);
    std::ostream::flush();
    _Var4 = fileName._M_dataplus;
    iVar9 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&header,_Var4._M_p,iVar9);
    pBVar18 = Imf_2_5::TiledRgbaInputFile::dataWindow((TiledRgbaInputFile *)&header);
    iVar9 = (pBVar18->min).x;
    if ((pBVar18->max).x - iVar9 != 399) {
      __assert_fail("dw.max.x - dw.min.x + 1 == width",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x217,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    iVar23 = (pBVar18->min).y;
    if ((pBVar18->max).y - iVar23 != 299) {
      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x218,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar9 != 0) {
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x219,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar23 != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x21a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar17,1,400);
    for (iVar9 = 0; iVar23 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0)
        , iVar9 < iVar23; iVar9 = iVar9 + 1) {
      for (iVar23 = 0;
          iVar22 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0),
          iVar23 < iVar22; iVar23 = iVar23 + 1) {
        Imf_2_5::TiledRgbaInputFile::readTile((TiledRgbaInputFile *)&header,iVar23,iVar9,0);
        if ((iVar9 + iVar23 & 1U) != 1) {
          __assert_fail("tileBroken || (tilePresent == ((tileX + tileY) & 1))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                        ,0x232,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
      }
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    std::ostream::flush();
    phVar19 = &pRVar17->a;
    local_150 = (Rgba *)&pRVar15->a;
    uVar26 = 0;
    phVar21 = (half *)local_150;
    do {
      uVar30 = 0;
      do {
        fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar19[uVar30 * 4 + -3]._h * 4);
        if (((int)((uVar30 & 0xffffffff) / 0x1e) + (int)((uVar26 & 0xffffffff) / 0x28) & 1U) == 0) {
          if ((((fVar34 != -1.0) || (NAN(fVar34))) ||
              (fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar19[uVar30 * 4 + -2]._h * 4),
              fVar34 != -1.0)) ||
             (((NAN(fVar34) ||
               (fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar19[uVar30 * 4 + -1]._h * 4),
               fVar34 != -1.0)) ||
              ((NAN(fVar34) ||
               ((fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar19[uVar30 * 4]._h * 4),
                fVar34 != -1.0 || (NAN(fVar34))))))))) {
            __assert_fail("t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x24f,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
        else {
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar21[uVar30 * 4 + -3]._h * 4);
          if (((((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) ||
               (fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar19[uVar30 * 4 + -2]._h * 4),
               pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar21[uVar30 * 4 + -2]._h * 4),
               fVar34 != *pfVar1)) ||
              ((NAN(fVar34) || NAN(*pfVar1) ||
               (fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar19[uVar30 * 4 + -1]._h * 4),
               pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar21[uVar30 * 4 + -1]._h * 4),
               fVar34 != *pfVar1)))) ||
             ((NAN(fVar34) || NAN(*pfVar1) ||
              ((fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar19[uVar30 * 4]._h * 4),
               pfVar1 = (float *)((long)&half::_toFloat + (ulong)phVar21[uVar30 * 4]._h * 4),
               fVar34 != *pfVar1 || (NAN(fVar34) || NAN(*pfVar1))))))) {
            __assert_fail("t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x248,
                          "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
          }
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 != 400);
      uVar26 = uVar26 + 1;
      phVar19 = phVar19 + 0x640;
      phVar21 = phVar21 + 0x640;
    } while (uVar26 != 300);
    Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    operator_delete__(pRVar17);
    pRVar17 = (Rgba *)operator_new__(960000);
    lVar29 = 0;
    pRVar27 = pRVar17;
    do {
      lVar31 = 0;
      do {
        uVar7 = uVar3;
        uVar11 = uVar24;
        uVar12 = uVar24;
        uVar25 = uVar24;
        if (uVar3 == 0) {
          uVar12 = half::convert(-0x40800000);
          uVar11 = half::convert(-0x40800000);
          uVar25 = half::convert(-0x40800000);
          uVar7 = half::convert(-0x40800000);
        }
        pRVar27[lVar31] =
             (Rgba)((ulong)(uVar12 & 0xffff) |
                   (ulong)(uVar11 << 0x10) | (ulong)(uVar25 & 0xffff) << 0x20 | (ulong)uVar7 << 0x30
                   );
        lVar31 = lVar31 + 1;
      } while (lVar31 != 400);
      lVar29 = lVar29 + 1;
      pRVar27 = pRVar27 + 400;
    } while (lVar29 != 300);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"reading multiple tiles at a time,",0x21);
    std::ostream::flush();
    _Var4 = fileName._M_dataplus;
    iVar9 = Imf_2_5::globalThreadCount();
    Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile((TiledRgbaInputFile *)&header,_Var4._M_p,iVar9);
    pBVar18 = Imf_2_5::TiledRgbaInputFile::dataWindow((TiledRgbaInputFile *)&header);
    iVar9 = (pBVar18->min).x;
    if ((pBVar18->max).x - iVar9 != 399) {
      __assert_fail("dw.max.x - dw.min.x + 1 == width",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x261,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    iVar23 = (pBVar18->min).y;
    if ((pBVar18->max).y - iVar23 != 299) {
      __assert_fail("dw.max.y - dw.min.y + 1 == height",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x262,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar9 != 0) {
      __assert_fail("dw.min.x == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x263,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    if (iVar23 != 0) {
      __assert_fail("dw.min.y == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                    ,0x264,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
    }
    Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar17,1,400);
    iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
    if (0 < iVar9) break;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," comparing",10);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
    std::ostream::put('x');
    std::ostream::flush();
    std::ostream::flush();
    phVar21 = &pRVar17->a;
    lVar29 = 0;
    do {
      lVar31 = 0;
      do {
        fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -3]._h * 4);
        if (((((fVar34 != -1.0) || (NAN(fVar34))) ||
             (fVar35 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -2]._h * 4),
             fVar35 != -1.0)) ||
            (((NAN(fVar35) ||
              (fVar35 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -1]._h * 4),
              fVar35 != -1.0)) ||
             ((NAN(fVar35) ||
              ((fVar35 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4]._h * 4),
               fVar35 != -1.0 || (NAN(fVar35))))))))) &&
           (((pfVar1 = (float *)((long)&half::_toFloat +
                                (ulong)((half *)((long)local_150 + (lVar31 * 4 + -3) * 2))->_h * 4),
             fVar34 != *pfVar1 ||
             ((((NAN(fVar34) || NAN(*pfVar1) ||
                (fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -2]._h * 4)
                , pfVar1 = (float *)((long)&half::_toFloat +
                                    (ulong)((half *)((long)local_150 + (lVar31 * 4 + -2) * 2))->_h *
                                    4), fVar34 != *pfVar1)) || (NAN(fVar34) || NAN(*pfVar1))) ||
              ((fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -1]._h * 4),
               pfVar1 = (float *)((long)&half::_toFloat +
                                 (ulong)((half *)((long)local_150 + (lVar31 * 4 + -1) * 2))->_h * 4)
               , fVar34 != *pfVar1 || (NAN(fVar34) || NAN(*pfVar1))))))) ||
            ((fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4]._h * 4),
             pfVar1 = (float *)((long)&half::_toFloat +
                               (ulong)((half *)((long)local_150 + lVar31 * 4 * 2))->_h * 4),
             fVar34 != *pfVar1 || (NAN(fVar34) || NAN(*pfVar1))))))) {
          __assert_fail("(t.r == -1 && t.g == -1 && t.b == -1 && t.a == -1) || (t.r == s.r && t.g == s.g && t.b == s.b && t.a == s.a)"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                        ,0x287,
                        "void (anonymous namespace)::writeReadIncomplete(const std::string &)");
        }
        lVar31 = lVar31 + 1;
      } while (lVar31 != 400);
      lVar29 = lVar29 + 1;
      phVar21 = phVar21 + 0x640;
      local_150 = (Rgba *)((long)local_150 + 0xc80);
    } while (lVar29 != 300);
    Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
    operator_delete__(pRVar17);
    remove(fileName._M_dataplus._M_p);
    operator_delete__(pRVar15);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)fileName._M_dataplus._M_p != &fileName.field_2) {
      operator_delete(fileName._M_dataplus._M_p,
                      CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                               fileName.field_2._M_allocated_capacity._0_4_) + 1);
    }
    bVar33 = uVar13 < 3;
    uVar13 = uVar13 + 1;
    if ((bVar5 & bVar33) == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"\nreading multi-layer file",0x19);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
      std::ostream::put('x');
      std::ostream::flush();
      fileName_1._M_dataplus._M_p = (pointer)&fileName_1.field_2;
      pcVar2 = (tempDir->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&fileName_1,pcVar2,pcVar2 + tempDir->_M_string_length);
      std::__cxx11::string::append((char *)&fileName_1);
      b = (char *)operator_new__(0xdc56);
      b_00 = (char *)operator_new__(0xdc56);
      uVar26 = 0;
      pcVar28 = b_00;
      local_150 = (Rgba *)b;
      do {
        uVar30 = uVar26 & 0xffffffff;
        lVar29 = -0xed;
        uVar13 = 0;
        do {
          iVar23 = (int)(uVar30 / 0x17) + (int)(uVar30 / 0x17) * -0x18 + (int)uVar26 +
                   (uVar13 / 0x11) * -0x11;
          iVar9 = (int)lVar29;
          fVar34 = (float)(iVar23 + iVar9 + 0xed);
          if (iVar23 + iVar9 == -0xed) {
            sVar8 = (short)((uint)fVar34 >> 0x10);
          }
          else {
            sVar8 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar34 >> 0x17) * 2);
            if (sVar8 == 0) {
              sVar8 = half::convert((int)fVar34);
            }
            else {
              sVar8 = sVar8 + (short)(((uint)fVar34 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar34 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          iVar23 = (int)uVar26 + (int)(uVar30 / 0x1d) * -2 + (int)(uVar30 / 0x1d) * -0x1b +
                   (uVar13 / 0x13) * -0x13;
          fVar34 = (float)(iVar23 + iVar9 + 0xed);
          *(short *)((long)local_150 + lVar29 * 2 + 0x1da) = sVar8;
          if (iVar23 + iVar9 == -0xed) {
            sVar8 = (short)((uint)fVar34 >> 0x10);
          }
          else {
            sVar8 = *(short *)((long)&half::_eLut + (ulong)((uint)fVar34 >> 0x17) * 2);
            if (sVar8 == 0) {
              sVar8 = half::convert((int)fVar34);
            }
            else {
              sVar8 = sVar8 + (short)(((uint)fVar34 & 0x7fffff) + 0xfff +
                                      (uint)(((uint)fVar34 >> 0xd & 1) != 0) >> 0xd);
            }
          }
          *(short *)(pcVar28 + lVar29 * 2 + 0x1da) = sVar8;
          uVar13 = uVar13 + 1;
          lVar29 = lVar29 + 1;
        } while (lVar29 != 0);
        uVar26 = uVar26 + 1;
        pcVar28 = pcVar28 + 0x1da;
        local_150 = (Rgba *)((long)local_150 + 0x1da);
      } while (uVar26 != 0x77);
      fileName._M_dataplus._M_p = (pointer)0x0;
      Imf_2_5::Header::Header
                (&header,0xed,0x77,1.0,(V2f *)&fileName,1.0,INCREASING_Y,ZIP_COMPRESSION);
      fileName._M_dataplus._M_p = (pointer)0x2000000020;
      fileName._M_string_length = 0;
      Imf_2_5::Header::setTileDescription(&header,(TileDescription *)&fileName);
      pCVar20 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar20,"R",(Channel *)&fileName);
      pCVar20 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar20,"foo.R",(Channel *)&fileName);
      out._outputFile._0_4_ = 0;
      out._toYa = (ToYa *)0x0;
      Imf_2_5::Slice::Slice((Slice *)&fileName,HALF,b,2,0x1da,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"R",(Slice *)&fileName);
      Imf_2_5::Slice::Slice((Slice *)&fileName,HALF,b_00,2,0x1da,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"foo.R",(Slice *)&fileName);
      _Var4 = fileName_1._M_dataplus;
      iVar9 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile
                ((TiledOutputFile *)&fileName,_Var4._M_p,&header,iVar9);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&fileName,(FrameBuffer *)&out);
      iVar9 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&fileName,0);
      iVar23 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&fileName,0);
      Imf_2_5::TiledOutputFile::writeTiles
                ((TiledOutputFile *)&fileName,0,iVar9 + -1,0,iVar23 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fileName);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      Imf_2_5::Header::~Header(&header);
      _Var4 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      fileName.field_2._M_allocated_capacity._0_4_ =
           fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      iVar9 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var4._M_p,&fileName,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pRVar15 = (Rgba *)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar15,1,0xed);
      iVar9 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar23 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar9 + -1,0,iVar23 + -1,0);
      phVar21 = &pRVar15->a;
      lVar29 = 0;
      pcVar28 = b;
      do {
        lVar31 = 0;
        do {
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -3]._h * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar28 + lVar31 * 2) * 4);
          if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
            __assert_fail("p3[y][x].r == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2ca,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -2]._h * 4);
          if ((fVar34 != 0.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2cb,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -1]._h * 4);
          if ((fVar34 != 0.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2cc,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4]._h * 4);
          if ((fVar34 != 1.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2cd,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != 0xed);
        lVar29 = lVar29 + 1;
        phVar21 = phVar21 + 0x3b4;
        pcVar28 = pcVar28 + 0x1da;
      } while (lVar29 != 0x77);
      operator_delete__(pRVar15);
      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      _Var4 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
      fileName._M_string_length = 3;
      iVar9 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var4._M_p,&fileName,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pRVar15 = (Rgba *)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar15,1,0xed);
      iVar9 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar23 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar9 + -1,0,iVar23 + -1,0);
      phVar21 = &pRVar15->a;
      lVar29 = 0;
      pcVar28 = b_00;
      do {
        lVar31 = 0;
        do {
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -3]._h * 4);
          pfVar1 = (float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar28 + lVar31 * 2) * 4);
          if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2dd,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -2]._h * 4);
          if ((fVar34 != 0.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2de,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -1]._h * 4);
          if ((fVar34 != 0.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2df,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4]._h * 4);
          if ((fVar34 != 1.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2e0,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != 0xed);
        lVar29 = lVar29 + 1;
        phVar21 = phVar21 + 0x3b4;
        pcVar28 = pcVar28 + 0x1da;
      } while (lVar29 != 0x77);
      operator_delete__(pRVar15);
      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      _Var4 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      fileName.field_2._M_allocated_capacity._0_4_ =
           fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      iVar9 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var4._M_p,&fileName,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pRVar15 = (Rgba *)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar15,1,0xed);
      iVar9 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar23 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar9 + -1,0,iVar23 / 2 + -1,0);
      fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
      fileName._M_string_length = 3;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      Imf_2_5::TiledRgbaInputFile::setLayerName((TiledRgbaInputFile *)&header,&fileName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar15,1,0xed);
      iVar9 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar23 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar9 + -1,iVar23 / 2,iVar22 + -1,0);
      phVar21 = &pRVar15->a;
      lVar29 = 0;
      pcVar28 = b;
      local_150 = (Rgba *)b_00;
      do {
        lVar31 = 0;
        do {
          iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
          uVar13 = Imf_2_5::TiledRgbaInputFile::tileYSize((TiledRgbaInputFile *)&header);
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -3]._h * 4);
          if (lVar29 < (int)(uVar13 * (iVar9 / 2))) {
            pfVar1 = (float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar28 + lVar31 * 2) * 4)
            ;
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p3[y][x].r == p1[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x2fb,
                            "void (anonymous namespace)::writeReadLayers(const std::string &)");
            }
          }
          else {
            pfVar1 = (float *)((long)&half::_toFloat +
                              (ulong)*(ushort *)((long)local_150 + lVar31 * 2) * 4);
            if ((fVar34 != *pfVar1) || (NAN(fVar34) || NAN(*pfVar1))) {
              __assert_fail("p3[y][x].r == p2[y][x]",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                            ,0x2fd,
                            "void (anonymous namespace)::writeReadLayers(const std::string &)");
            }
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -2]._h * 4);
          if ((fVar34 != 0.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].g == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x2ff,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -1]._h * 4);
          if ((fVar34 != 0.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].b == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x300,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4]._h * 4);
          if ((fVar34 != 1.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x301,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != 0xed);
        lVar29 = lVar29 + 1;
        pcVar28 = pcVar28 + 0x1da;
        phVar21 = phVar21 + 0x3b4;
        local_150 = (Rgba *)((long)local_150 + 0x1da);
      } while (lVar29 != 0x77);
      operator_delete__(pRVar15);
      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      fileName._M_dataplus._M_p = (pointer)0x0;
      Imf_2_5::Header::Header
                (&header,0xed,0x77,1.0,(V2f *)&fileName,1.0,INCREASING_Y,ZIP_COMPRESSION);
      fileName._M_dataplus._M_p = (pointer)0x2000000020;
      fileName._M_string_length = 0;
      Imf_2_5::Header::setTileDescription(&header,(TileDescription *)&fileName);
      pCVar20 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar20,"Y",(Channel *)&fileName);
      pCVar20 = Imf_2_5::Header::channels(&header);
      Imf_2_5::Channel::Channel((Channel *)&fileName,HALF,1,1,false);
      Imf_2_5::ChannelList::insert(pCVar20,"foo.Y",(Channel *)&fileName);
      out._outputFile._0_4_ = 0;
      out._toYa = (ToYa *)0x0;
      Imf_2_5::Slice::Slice((Slice *)&fileName,HALF,b,2,0x1da,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"Y",(Slice *)&fileName);
      Imf_2_5::Slice::Slice((Slice *)&fileName,HALF,b_00,2,0x1da,1,1,0.0,(bool)in_R10B,false);
      Imf_2_5::FrameBuffer::insert((FrameBuffer *)&out,"foo.Y",(Slice *)&fileName);
      _Var4 = fileName_1._M_dataplus;
      iVar9 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledOutputFile::TiledOutputFile
                ((TiledOutputFile *)&fileName,_Var4._M_p,&header,iVar9);
      Imf_2_5::TiledOutputFile::setFrameBuffer((TiledOutputFile *)&fileName,(FrameBuffer *)&out);
      iVar9 = Imf_2_5::TiledOutputFile::numXTiles((TiledOutputFile *)&fileName,0);
      iVar23 = Imf_2_5::TiledOutputFile::numYTiles((TiledOutputFile *)&fileName,0);
      Imf_2_5::TiledOutputFile::writeTiles
                ((TiledOutputFile *)&fileName,0,iVar9 + -1,0,iVar23 + -1,0);
      Imf_2_5::TiledOutputFile::~TiledOutputFile((TiledOutputFile *)&fileName);
      std::
      _Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_2_5::Name,_std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>,_std::_Select1st<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>,_std::less<Imf_2_5::Name>,_std::allocator<std::pair<const_Imf_2_5::Name,_Imf_2_5::Slice>_>_>
                   *)&out);
      Imf_2_5::Header::~Header(&header);
      _Var4 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName._M_string_length = 0;
      fileName.field_2._M_allocated_capacity._0_4_ =
           fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
      iVar9 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var4._M_p,&fileName,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pRVar15 = (Rgba *)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar15,1,0xed);
      iVar9 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar23 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar9 + -1,0,iVar23 + -1,0);
      phVar21 = &pRVar15->a;
      lVar29 = 0;
      pcVar28 = b;
      do {
        lVar31 = 0;
        do {
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -3]._h * 4);
          fVar35 = *(float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar28 + lVar31 * 2) * 4);
          if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
            __assert_fail("p3[y][x].r == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x32a,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -2]._h * 4);
          if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
            __assert_fail("p3[y][x].g == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x32b,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -1]._h * 4);
          if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
            __assert_fail("p3[y][x].b == p1[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x32c,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4]._h * 4);
          if ((fVar34 != 1.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x32d,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != 0xed);
        lVar29 = lVar29 + 1;
        phVar21 = phVar21 + 0x3b4;
        pcVar28 = pcVar28 + 0x1da;
      } while (lVar29 != 0x77);
      operator_delete__(pRVar15);
      Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
      _Var4 = fileName_1._M_dataplus;
      fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
      fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
      fileName._M_string_length = 3;
      iVar9 = Imf_2_5::globalThreadCount();
      Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                ((TiledRgbaInputFile *)&header,_Var4._M_p,&fileName,iVar9);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)fileName._M_dataplus._M_p != &fileName.field_2) {
        operator_delete(fileName._M_dataplus._M_p,
                        CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                 fileName.field_2._M_allocated_capacity._0_4_) + 1);
      }
      pRVar15 = (Rgba *)operator_new__(0x37158);
      Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar15,1,0xed);
      iVar9 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
      iVar23 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
      Imf_2_5::TiledRgbaInputFile::readTiles
                ((TiledRgbaInputFile *)&header,0,iVar9 + -1,0,iVar23 + -1,0);
      phVar21 = &pRVar15->a;
      lVar29 = 0;
      pcVar28 = b_00;
      do {
        lVar31 = 0;
        do {
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -3]._h * 4);
          fVar35 = *(float *)((long)&half::_toFloat + (ulong)*(ushort *)(pcVar28 + lVar31 * 2) * 4);
          if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
            __assert_fail("p3[y][x].r == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x33d,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -2]._h * 4);
          if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
            __assert_fail("p3[y][x].g == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x33e,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -1]._h * 4);
          if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
            __assert_fail("p3[y][x].b == p2[y][x]",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x33f,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4]._h * 4);
          if ((fVar34 != 1.0) || (NAN(fVar34))) {
            __assert_fail("p3[y][x].a == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                          ,0x340,"void (anonymous namespace)::writeReadLayers(const std::string &)")
            ;
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 != 0xed);
        lVar29 = lVar29 + 1;
        phVar21 = phVar21 + 0x3b4;
        pcVar28 = pcVar28 + 0x1da;
        if (lVar29 == 0x77) {
          operator_delete__(pRVar15);
          Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
          _Var4 = fileName_1._M_dataplus;
          fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
          fileName._M_string_length = 0;
          fileName.field_2._M_allocated_capacity._0_4_ =
               fileName.field_2._M_allocated_capacity._0_4_ & 0xffffff00;
          iVar9 = Imf_2_5::globalThreadCount();
          Imf_2_5::TiledRgbaInputFile::TiledRgbaInputFile
                    ((TiledRgbaInputFile *)&header,_Var4._M_p,&fileName,iVar9);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fileName._M_dataplus._M_p != &fileName.field_2) {
            operator_delete(fileName._M_dataplus._M_p,
                            CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                     fileName.field_2._M_allocated_capacity._0_4_) + 1);
          }
          pRVar15 = (Rgba *)operator_new__(0x37158);
          Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar15,1,0xed);
          iVar9 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
          iVar23 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
          Imf_2_5::TiledRgbaInputFile::readTiles
                    ((TiledRgbaInputFile *)&header,0,iVar9 + -1,0,iVar23 / 2 + -1,0);
          fileName.field_2._M_allocated_capacity._0_4_ = 0x6f6f66;
          fileName._M_string_length = 3;
          fileName._M_dataplus._M_p = (pointer)&fileName.field_2;
          Imf_2_5::TiledRgbaInputFile::setLayerName((TiledRgbaInputFile *)&header,&fileName);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)fileName._M_dataplus._M_p != &fileName.field_2) {
            operator_delete(fileName._M_dataplus._M_p,
                            CONCAT44(fileName.field_2._M_allocated_capacity._4_4_,
                                     fileName.field_2._M_allocated_capacity._0_4_) + 1);
          }
          Imf_2_5::TiledRgbaInputFile::setFrameBuffer((TiledRgbaInputFile *)&header,pRVar15,1,0xed);
          iVar9 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
          iVar23 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
          iVar22 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
          Imf_2_5::TiledRgbaInputFile::readTiles
                    ((TiledRgbaInputFile *)&header,0,iVar9 + -1,iVar23 / 2,iVar22 + -1,0);
          phVar21 = &pRVar15->a;
          lVar29 = 0;
          pcVar28 = b;
          local_150 = (Rgba *)b_00;
          do {
            lVar31 = 0;
            do {
              iVar9 = Imf_2_5::TiledRgbaInputFile::numYTiles((TiledRgbaInputFile *)&header,0);
              uVar13 = Imf_2_5::TiledRgbaInputFile::tileYSize((TiledRgbaInputFile *)&header);
              fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -3]._h * 4);
              if (lVar29 < (int)(uVar13 * (iVar9 / 2))) {
                fVar35 = *(float *)((long)&half::_toFloat +
                                   (ulong)*(ushort *)(pcVar28 + lVar31 * 2) * 4);
                if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
                  __assert_fail("p3[y][x].r == p1[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x35c,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -2]._h * 4);
                if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
                  __assert_fail("p3[y][x].g == p1[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x35d,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -1]._h * 4);
                if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
                  __assert_fail("p3[y][x].b == p1[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x35e,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
              }
              else {
                fVar35 = *(float *)((long)&half::_toFloat +
                                   (ulong)*(ushort *)((long)local_150 + lVar31 * 2) * 4);
                if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
                  __assert_fail("p3[y][x].r == p2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x362,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -2]._h * 4);
                if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
                  __assert_fail("p3[y][x].g == p2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x363,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
                fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4 + -1]._h * 4);
                if ((fVar34 != fVar35) || (NAN(fVar34) || NAN(fVar35))) {
                  __assert_fail("p3[y][x].b == p2[y][x]",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                                ,0x364,
                                "void (anonymous namespace)::writeReadLayers(const std::string &)");
                }
              }
              fVar34 = *(float *)((long)&half::_toFloat + (ulong)phVar21[lVar31 * 4]._h * 4);
              if ((fVar34 != 1.0) || (NAN(fVar34))) {
                __assert_fail("p3[y][x].a == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                              ,0x367,
                              "void (anonymous namespace)::writeReadLayers(const std::string &)");
              }
              lVar31 = lVar31 + 1;
            } while (lVar31 != 0xed);
            lVar29 = lVar29 + 1;
            phVar21 = phVar21 + 0x3b4;
            pcVar28 = pcVar28 + 0x1da;
            local_150 = (Rgba *)((long)local_150 + 0x1da);
            if (lVar29 == 0x77) {
              operator_delete__(pRVar15);
              Imf_2_5::TiledRgbaInputFile::~TiledRgbaInputFile((TiledRgbaInputFile *)&header);
              remove(fileName_1._M_dataplus._M_p);
              operator_delete__(b_00);
              operator_delete__(b);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)fileName_1._M_dataplus._M_p != &fileName_1.field_2) {
                operator_delete(fileName_1._M_dataplus._M_p,
                                fileName_1.field_2._M_allocated_capacity + 1);
              }
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ok\n",3);
              std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
              std::ostream::put('x');
              std::ostream::flush();
              return;
            }
          } while( true );
        }
      } while( true );
    }
  }
  iVar9 = Imf_2_5::TiledRgbaInputFile::numXTiles((TiledRgbaInputFile *)&header,0);
  Imf_2_5::TiledRgbaInputFile::readTiles((TiledRgbaInputFile *)&header,0,iVar9 + -1,0,0,0);
  __assert_fail("tilesMissing || tilesBroken",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfTest/testTiledRgba.cpp"
                ,0x27a,"void (anonymous namespace)::writeReadIncomplete(const std::string &)");
}

Assistant:

void
testTiledRgba (const std::string &tempDir)
{
    try
    {
        cout << "Testing the tiled RGBA image interface" << endl;

	int maxThreads = ILMTHREAD_NAMESPACE::supportsThreads()? 3: 0;

	for (int n = 0; n <= maxThreads; ++n)
	{
	    if (ILMTHREAD_NAMESPACE::supportsThreads())
	    {
		setGlobalThreadCount (n);
		cout << "\nnumber of threads: " << globalThreadCount() << endl;
	    }

	    const int W[] = { 9, 69, 75, 80 };
	    const int H[] = { 7, 50, 52, 55 };

	    for (int i = 0; i < 4; ++i)
	    {
		cout << "\nImage size = " << W[i] << " x " << H[i] << endl;

		for (int comp = 0; comp < NUM_COMPRESSION_METHODS; ++comp)
		{
		    //
		    // for tiled files, ZIPS and ZIP are the same thing
		    //

		    if (comp == ZIP_COMPRESSION)
			comp++;

		    if (i == 0)
		    {
			//
			// for single-pixel tiles, we don't gain anything
			// by testing multiple image sizes (and singe-pixel
			// tiles are rather slow anyway)
			//

			writeRead (tempDir, W[i], H[i], Compression (comp), 1, 1);
		    }

		    writeRead (tempDir, W[i], H[i], Compression (comp), 35, 26);
		    writeRead (tempDir, W[i], H[i], Compression (comp), 75, 52);
		    writeRead (tempDir, W[i], H[i], Compression (comp), 264, 129);
		}
	    }

	    writeReadIncomplete (tempDir);
	}

	writeReadLayers (tempDir);

        cout << "ok\n" << endl;
    }
    catch (const std::exception &e)
    {
        cerr << "ERROR -- caught exception: " << e.what() << endl;
        assert (false);
    }
}